

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * __thiscall PrimitiveTestClass::FillValues<char*>(PrimitiveTestClass *this)

{
  char *pcVar1;
  ulong local_20;
  size_t i;
  char *ret;
  PrimitiveTestClass *this_local;
  
  pcVar1 = (char *)operator_new__((long)this->SIZE);
  for (local_20 = 0; local_20 < (ulong)(long)this->SIZE; local_20 = local_20 + 1) {
    pcVar1[local_20] = -1;
  }
  return pcVar1;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }